

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O0

int green_coroutine_release(green_coroutine_t coro)

{
  int iVar1;
  green_coroutine_t coro_local;
  
  if (coro == (green_coroutine_t)0x0) {
    fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","coro != ((void*)0)",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
            ,0x139);
    fflush(_stderr);
    abort();
  }
  if (coro->loop == (green_loop_t)0x0) {
    fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","coro->loop != ((void*)0)",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
            ,0x13a);
    fflush(_stderr);
    abort();
  }
  iVar1 = coro->refs + -1;
  coro->refs = iVar1;
  if (iVar1 == 0) {
    if (coro->stack == (void *)0x0) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","coro->stack != ((void*)0)",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0x13d);
      fflush(_stderr);
      abort();
    }
    green_free(coro->stack);
    coro->stack = (void *)0x0;
    coro->loop->coroutines = coro->loop->coroutines + -1;
    green_free(coro);
  }
  return 0;
}

Assistant:

int green_coroutine_release(green_coroutine_t coro)
{
    green_assert(coro != NULL);
    green_assert(coro->loop != NULL);
    if (--coro->refs == 0) {
#if GREEN_USE_UCONTEXT
        green_assert(coro->stack != NULL);
        green_free(coro->stack);
        coro->stack = NULL;
#endif
        --coro->loop->coroutines;
        green_free(coro);
    }
    return GREEN_SUCCESS;
}